

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

Bitset * __thiscall
diligent_spirv_cross::ParsedIR::get_buffer_block_type_flags
          (Bitset *__return_storage_ptr__,ParsedIR *this,SPIRType *type)

{
  bool bVar1;
  TypedID<(diligent_spirv_cross::Types)1> TVar2;
  Bitset *pBVar3;
  size_t sVar4;
  uint local_2c;
  uint32_t i;
  SPIRType *type_local;
  ParsedIR *this_local;
  Bitset *all_members_flags;
  
  bVar1 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::empty
                    (&(type->member_types).
                      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                    );
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x40);
    Bitset::Bitset(__return_storage_ptr__);
  }
  else {
    TVar2 = TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
    pBVar3 = get_member_decoration_bitset(this,(TypeID)TVar2.id,0);
    Bitset::Bitset(__return_storage_ptr__,pBVar3);
    for (local_2c = 1;
        sVar4 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                          (&(type->member_types).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                          ), local_2c < (uint)sVar4; local_2c = local_2c + 1) {
      TVar2 = TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
      pBVar3 = get_member_decoration_bitset(this,(TypeID)TVar2.id,local_2c);
      Bitset::merge_and(__return_storage_ptr__,pBVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Bitset ParsedIR::get_buffer_block_type_flags(const SPIRType &type) const
{
	if (type.member_types.empty())
		return {};

	Bitset all_members_flags = get_member_decoration_bitset(type.self, 0);
	for (uint32_t i = 1; i < uint32_t(type.member_types.size()); i++)
		all_members_flags.merge_and(get_member_decoration_bitset(type.self, i));
	return all_members_flags;
}